

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-cpuid.c
# Opt level: O2

int cpuid_is_vendor_intel(void)

{
  long lVar1;
  int iVar2;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  lVar1 = cpuid_basic_info(0);
  local_18 = *(undefined4 *)(lVar1 + 4);
  local_14 = *(undefined4 *)(lVar1 + 8);
  local_10 = *(undefined4 *)(lVar1 + 0xc);
  iVar2 = bcmp(&local_18,"GenuineIntel",0xd);
  return (int)(iVar2 == 0);
}

Assistant:

int cpuid_is_vendor_intel(void) {
  asm_cpuid_data cpudata;
  union {
    char c[16];
    uint32_t i[16 / sizeof(uint32_t)];
  } vendor_id;
  memset(&vendor_id.c, 0, sizeof(vendor_id));
  asm_cpuid(0, &cpudata);
  vendor_id.i[0] = cpudata.ebx;
  vendor_id.i[1] = cpudata.edx;
  vendor_id.i[2] = cpudata.ecx;
  raplcap_log(DEBUG, "cpuid_is_vendor_intel: vendor_id=%s\n", vendor_id.c);
  return !strncmp(vendor_id.c, CPUID_VENDOR_ID_GENUINE_INTEL, sizeof(CPUID_VENDOR_ID_GENUINE_INTEL));
}